

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallTargetGenerator.cxx
# Opt level: O0

string * computeInstallObjectDir
                   (string *__return_storage_ptr__,cmGeneratorTarget *gt,string *config)

{
  ulong uVar1;
  string *psVar2;
  allocator<char> local_22;
  undefined1 local_21;
  string *local_20;
  string *config_local;
  cmGeneratorTarget *gt_local;
  string *objectDir;
  
  local_21 = 0;
  local_20 = config;
  config_local = (string *)gt;
  gt_local = (cmGeneratorTarget *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"objects",&local_22);
  std::allocator<char>::~allocator(&local_22);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"-");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)local_20);
  }
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"/");
  psVar2 = cmGeneratorTarget::GetName_abi_cxx11_((cmGeneratorTarget *)config_local);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)psVar2);
  return __return_storage_ptr__;
}

Assistant:

static std::string computeInstallObjectDir(cmGeneratorTarget* gt,
                                           std::string const& config)
{
  std::string objectDir = "objects";
  if (!config.empty()) {
    objectDir += "-";
    objectDir += config;
  }
  objectDir += "/";
  objectDir += gt->GetName();
  return objectDir;
}